

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void errorAt(Token *token,char *message)

{
  undefined8 in_RSI;
  int *in_RDI;
  
  if (!parser.panicMode) {
    parser.panicMode = true;
    fprintf(_stderr,"[line %d] Error",(ulong)(uint)in_RDI[5]);
    if (*in_RDI == 0x27) {
      fprintf(_stderr," at end");
    }
    else if (*in_RDI != 0x26) {
      fprintf(_stderr," at \'%.*s\'",(ulong)(uint)in_RDI[4],*(undefined8 *)(in_RDI + 2));
    }
    fprintf(_stderr,": %s\n",in_RSI);
    parser.hadError = true;
  }
  return;
}

Assistant:

static void errorAt(Token *token, const char *message) {
    if (parser.panicMode) return;

    parser.panicMode = true;

    fprintf(stderr, "[line %d] Error", token->line);

    if (token->type == TOKEN_EOF) {
        fprintf(stderr, " at end");
    } else if (token->type == TOKEN_ERROR) {
        // Nothing.
    } else {
        fprintf(stderr, " at '%.*s'", token->length, token->start);
    }

    fprintf(stderr, ": %s\n", message);
    parser.hadError = true;
}